

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceputils.c
# Opt level: O1

int init_scep(void)

{
  nid_messageType = OBJ_create("2.16.840.1.113733.1.9.2","messageType","messageType");
  if ((((nid_messageType != 0) &&
       (nid_pkiStatus = OBJ_create("2.16.840.1.113733.1.9.3","pkiStatus","pkiStatus"),
       nid_pkiStatus != 0)) &&
      (nid_failInfo = OBJ_create("2.16.840.1.113733.1.9.4","failInfo","failInfo"), nid_failInfo != 0
      )) && (((nid_senderNonce = OBJ_create("2.16.840.1.113733.1.9.5","senderNonce","senderNonce"),
              nid_senderNonce != 0 &&
              (nid_recipientNonce =
                    OBJ_create("2.16.840.1.113733.1.9.6","recipientNonce","recipientNonce"),
              nid_recipientNonce != 0)) &&
             ((nid_transId = OBJ_create("2.16.840.1.113733.1.9.7","transId","transId"),
              nid_transId != 0 &&
              (nid_extensionReq =
                    OBJ_create("2.16.840.1.113733.1.9.8","extensionReq","extensionReq"),
              nid_extensionReq != 0)))))) {
    return 0;
  }
  init_scep_cold_1();
  return 1;
}

Assistant:

int init_scep() {
	/* Create OpenSSL NIDs */
	nid_messageType = OBJ_create("2.16.840.1.113733.1.9.2", "messageType",
		"messageType");
	if (nid_messageType == 0) {
		goto err;
	}
	nid_pkiStatus = OBJ_create("2.16.840.1.113733.1.9.3", "pkiStatus",
		"pkiStatus");
	if (nid_pkiStatus == 0) {
		goto err;
	}
	nid_failInfo = OBJ_create("2.16.840.1.113733.1.9.4", "failInfo",
		"failInfo");
	if (nid_failInfo == 0) {
		goto err;
	}
	nid_senderNonce = OBJ_create("2.16.840.1.113733.1.9.5", "senderNonce",
		"senderNonce");
	if (nid_senderNonce == 0) {
		goto err;
	}
	nid_recipientNonce = OBJ_create("2.16.840.1.113733.1.9.6",
				"recipientNonce", "recipientNonce");
	if (nid_recipientNonce == 0) {
		goto err;
	}
	nid_transId = OBJ_create("2.16.840.1.113733.1.9.7", "transId",
		"transId");
	if (nid_transId == 0) {
		goto err;
	}
	nid_extensionReq = OBJ_create("2.16.840.1.113733.1.9.8",
				"extensionReq", "extensionReq");
	if (nid_extensionReq == 0) {
		goto err;
	}
	return (0);

err:
	fprintf(stderr, "%s: cannot create OID\n", pname);
	return (1);

}